

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::Program::setRandomUniforms
          (Program *this,vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_> *uniforms,
          string *shaderNameManglingSuffix,Random *rnd)

{
  pointer source;
  float fVar1;
  GLuint program;
  DataType DVar2;
  pointer pVVar3;
  uint uVar4;
  GLint location;
  float fVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  float fVar9;
  float val [4];
  
  use(this);
  lVar8 = 100;
  for (lVar6 = 0;
      pVVar3 = (uniforms->
               super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>)._M_impl.
               super__Vector_impl_data._M_start,
      lVar6 < (int)(((long)(uniforms->
                           super__Vector_base<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3) / 0xa8);
      lVar6 = lVar6 + 1) {
    source = pVVar3 + lVar6;
    uVar4 = glu::getDataTypeScalarSize(pVVar3[lVar6].type);
    program = this->m_programGL;
    mangleShaderNames((string *)val,&source->name,shaderNameManglingSuffix);
    location = glwGetUniformLocation(program,(GLchar *)CONCAT44(val[1],val[0]));
    std::__cxx11::string::~string((string *)val);
    if (-1 < location) {
      DVar2 = source->type;
      if (DVar2 - TYPE_FLOAT < 4) {
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          fVar5 = *(float *)((long)pVVar3 + uVar7 * 4 + lVar8 + -0x40);
          fVar1 = *(float *)((long)&(pVVar3->name)._M_dataplus._M_p + uVar7 * 4 + lVar8);
          fVar9 = deRandom_getFloat(&rnd->m_rnd);
          val[uVar7] = fVar9 * (fVar1 - fVar5) + fVar5;
        }
        switch(source->type) {
        case TYPE_FLOAT:
          glwUniform1f(location,val[0]);
          break;
        case TYPE_FLOAT_VEC2:
          glwUniform2f(location,val[0],val[1]);
          break;
        case TYPE_FLOAT_VEC3:
          glwUniform3f(location,val[0],val[1],val[2]);
          break;
        case TYPE_FLOAT_VEC4:
          glwUniform4f(location,val[0],val[1],val[2],val[3]);
        }
      }
      else if (DVar2 - TYPE_FLOAT_MAT2 < 9 || DVar2 - TYPE_DOUBLE_MAT2 < 9) {
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          fVar5 = *(float *)((long)pVVar3 + uVar7 * 4 + lVar8 + -0x40);
          fVar1 = *(float *)((long)&(pVVar3->name)._M_dataplus._M_p + uVar7 * 4 + lVar8);
          fVar9 = deRandom_getFloat(&rnd->m_rnd);
          val[uVar7] = fVar9 * (fVar1 - fVar5) + fVar5;
        }
        if (source->type - TYPE_FLOAT_MAT2 < 9) {
          switch(source->type) {
          case TYPE_FLOAT_MAT2:
            glwUniformMatrix2fv(location,1,'\0',val);
            break;
          case TYPE_FLOAT_MAT2X3:
            glwUniformMatrix2x3fv(location,1,'\0',val);
            break;
          case TYPE_FLOAT_MAT2X4:
            glwUniformMatrix2x4fv(location,1,'\0',val);
            break;
          case TYPE_FLOAT_MAT3X2:
            glwUniformMatrix3x2fv(location,1,'\0',val);
            break;
          case TYPE_FLOAT_MAT3:
            glwUniformMatrix3fv(location,1,'\0',val);
            break;
          case TYPE_FLOAT_MAT3X4:
            glwUniformMatrix3x4fv(location,1,'\0',val);
            break;
          case TYPE_FLOAT_MAT4X2:
            glwUniformMatrix4x2fv(location,1,'\0',val);
            break;
          case TYPE_FLOAT_MAT4X3:
            glwUniformMatrix4x3fv(location,1,'\0',val);
            break;
          case TYPE_FLOAT_MAT4:
            glwUniformMatrix4fv(location,1,'\0',val);
          }
        }
      }
      else if (DVar2 - TYPE_INT < 4) {
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          fVar5 = (float)de::Random::getInt(rnd,*(int *)((long)pVVar3 + uVar7 * 4 + lVar8 + -0x40),
                                            *(int *)((long)&(pVVar3->name)._M_dataplus._M_p +
                                                    uVar7 * 4 + lVar8));
          val[uVar7] = fVar5;
        }
        switch(source->type) {
        case TYPE_INT:
          glwUniform1i(location,(GLint)val[0]);
          break;
        case TYPE_INT_VEC2:
          glwUniform2i(location,(GLint)val[0],(GLint)val[1]);
          break;
        case TYPE_INT_VEC3:
          glwUniform3i(location,(GLint)val[0],(GLint)val[1],(GLint)val[2]);
          break;
        case TYPE_INT_VEC4:
          glwUniform4i(location,(GLint)val[0],(GLint)val[1],(GLint)val[2],(GLint)val[3]);
        }
      }
      else if (DVar2 - TYPE_UINT < 4) {
        if ((int)uVar4 < 1) {
          uVar4 = 0;
        }
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          fVar5 = (float)de::Random::getInt(rnd,*(int *)((long)pVVar3 + uVar7 * 4 + lVar8 + -0x40),
                                            *(int *)((long)&(pVVar3->name)._M_dataplus._M_p +
                                                    uVar7 * 4 + lVar8));
          val[uVar7] = fVar5;
        }
        switch(source->type) {
        case TYPE_UINT:
          glwUniform1ui(location,(GLuint)val[0]);
          break;
        case TYPE_UINT_VEC2:
          glwUniform2ui(location,(GLuint)val[0],(GLuint)val[1]);
          break;
        case TYPE_UINT_VEC3:
          glwUniform3ui(location,(GLuint)val[0],(GLuint)val[1],(GLuint)val[2]);
          break;
        case TYPE_UINT_VEC4:
          glwUniform4ui(location,(GLuint)val[0],(GLuint)val[1],(GLuint)val[2],(GLuint)val[3]);
        }
      }
    }
    lVar8 = lVar8 + 0xa8;
  }
  return;
}

Assistant:

void Program::setRandomUniforms (const vector<VarSpec>& uniforms, const string& shaderNameManglingSuffix, Random& rnd) const
{
	use();

	for (int unifNdx = 0; unifNdx < (int)uniforms.size(); unifNdx++)
	{
		const VarSpec&	spec			= uniforms[unifNdx];
		const int		typeScalarSize	= glu::getDataTypeScalarSize(spec.type);
		const int		location		= glGetUniformLocation(m_programGL, mangleShaderNames(spec.name, shaderNameManglingSuffix).c_str());
		if (location < 0)
			continue;

		if (glu::isDataTypeFloatOrVec(spec.type))
		{
			float val[4];
			for (int i = 0; i < typeScalarSize; i++)
				val[i] = rnd.getFloat(spec.minValue.f[i], spec.maxValue.f[i]);

			switch (spec.type)
			{
				case glu::TYPE_FLOAT:		glUniform1f(location, val[0]);							break;
				case glu::TYPE_FLOAT_VEC2:	glUniform2f(location, val[0], val[1]);					break;
				case glu::TYPE_FLOAT_VEC3:	glUniform3f(location, val[0], val[1], val[2]);			break;
				case glu::TYPE_FLOAT_VEC4:	glUniform4f(location, val[0], val[1], val[2], val[3]);	break;
				default: DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeMatrix(spec.type))
		{
			float val[4*4];
			for (int i = 0; i < typeScalarSize; i++)
				val[i] = rnd.getFloat(spec.minValue.f[i], spec.maxValue.f[i]);

			switch (spec.type)
			{
				case glu::TYPE_FLOAT_MAT2:		glUniformMatrix2fv		(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT3:		glUniformMatrix3fv		(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT4:		glUniformMatrix4fv		(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT2X3:	glUniformMatrix2x3fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT2X4:	glUniformMatrix2x4fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT3X2:	glUniformMatrix3x2fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT3X4:	glUniformMatrix3x4fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT4X2:	glUniformMatrix4x2fv	(location, 1, GL_FALSE, &val[0]); break;
				case glu::TYPE_FLOAT_MAT4X3:	glUniformMatrix4x3fv	(location, 1, GL_FALSE, &val[0]); break;
				default: DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeIntOrIVec(spec.type))
		{
			int val[4];
			for (int i = 0; i < typeScalarSize; i++)
				val[i] = rnd.getInt(spec.minValue.i[i], spec.maxValue.i[i]);

			switch (spec.type)
			{
				case glu::TYPE_INT:			glUniform1i(location, val[0]);							break;
				case glu::TYPE_INT_VEC2:	glUniform2i(location, val[0], val[1]);					break;
				case glu::TYPE_INT_VEC3:	glUniform3i(location, val[0], val[1], val[2]);			break;
				case glu::TYPE_INT_VEC4:	glUniform4i(location, val[0], val[1], val[2], val[3]);	break;
				default: DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeUintOrUVec(spec.type))
		{
			deUint32 val[4];
			for (int i = 0; i < typeScalarSize; i++)
			{
				DE_ASSERT(spec.minValue.i[i] >= 0 && spec.maxValue.i[i] >= 0);
				val[i] = (deUint32)rnd.getInt(spec.minValue.i[i], spec.maxValue.i[i]);
			}

			switch (spec.type)
			{
				case glu::TYPE_UINT:		glUniform1ui(location, val[0]);							break;
				case glu::TYPE_UINT_VEC2:	glUniform2ui(location, val[0], val[1]);					break;
				case glu::TYPE_UINT_VEC3:	glUniform3ui(location, val[0], val[1], val[2]);			break;
				case glu::TYPE_UINT_VEC4:	glUniform4ui(location, val[0], val[1], val[2], val[3]);	break;
				default: DE_ASSERT(false);
			}
		}
		else
			DE_ASSERT(false);
	}
}